

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

StringRef llvm::sys::path::root_directory(StringRef path,Style style)

{
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  path *this;
  Style in_R8D;
  bool bVar4;
  bool bVar5;
  StringRef path_00;
  StringRef SVar6;
  undefined1 auStack_98 [8];
  const_iterator b;
  const_iterator pos;
  
  sVar3 = path.Length;
  this = (path *)path.Data;
  path_00.Length._0_4_ = style;
  path_00.Data = (char *)sVar3;
  path_00.Length._4_4_ = 0;
  begin((const_iterator *)auStack_98,this,path_00,in_R8D);
  pcVar2 = (char *)b.Path.Length;
  b._40_8_ = auStack_98;
  if ((auStack_98 != (undefined1  [8])this) || (b.Component.Length != sVar3)) {
    if ((b.Component.Data < (char *)0x3) ||
       ((cVar1 = *(char *)b.Path.Length, cVar1 != '/' && (cVar1 != '\\' || style != windows)))) {
      bVar4 = false;
    }
    else {
      bVar4 = *(char *)(b.Path.Length + 1) == cVar1;
    }
    if (b.Component.Data == (char *)0x0 || style != windows) {
      bVar5 = false;
    }
    else {
      bVar5 = b.Component.Data[b.Path.Length - 1] == ':';
    }
    if (((bool)(bVar5 | bVar4)) &&
       ((const_iterator::operator++((const_iterator *)&b.S), (path *)b._40_8_ != this ||
        (b.Component.Length != sVar3)))) {
      if (b.Component.Data == (char *)0x0) goto LAB_00d9a244;
      if ((*pcVar2 == '/') || (style == windows && *pcVar2 == '\\')) goto LAB_00d9a1e3;
    }
    if (!bVar4) {
      if (b.Component.Data == (char *)0x0) {
LAB_00d9a244:
        __assert_fail("Index < Length && \"Invalid index!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/StringRef.h"
                      ,0xf9,"char llvm::StringRef::operator[](size_t) const");
      }
      pcVar2 = (char *)b.Path.Length;
      if ((*(char *)b.Path.Length == '/') || (style == windows && *(char *)b.Path.Length == '\\'))
      goto LAB_00d9a1e3;
    }
  }
  b.Component.Data = (char *)0x0;
  pcVar2 = (char *)0x0;
LAB_00d9a1e3:
  SVar6.Length = (size_t)b.Component.Data;
  SVar6.Data = pcVar2;
  return SVar6;
}

Assistant:

StringRef root_directory(StringRef path, Style style) {
  const_iterator b = begin(path, style), pos = b, e = end(path);
  if (b != e) {
    bool has_net =
        b->size() > 2 && is_separator((*b)[0], style) && (*b)[1] == (*b)[0];
    bool has_drive = (real_style(style) == Style::windows) && b->endswith(":");

    if ((has_net || has_drive) &&
        // {C:,//net}, skip to the next component.
        (++pos != e) && is_separator((*pos)[0], style)) {
      return *pos;
    }

    // POSIX style root directory.
    if (!has_net && is_separator((*b)[0], style)) {
      return *b;
    }
  }

  // No path or no root.
  return StringRef();
}